

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

Result file_read_aligned(char *filename,size_t align,FileData *out_file_data)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  u8 *__ptr;
  size_t sVar4;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    file_read_aligned_cold_6();
    goto LAB_0018d3d9;
  }
  iVar2 = fseek(__stream,0,2);
  if (iVar2 < 0) {
    file_read_aligned_cold_1();
LAB_0018d3c9:
    bVar1 = false;
  }
  else {
    pcVar3 = (char *)ftell(__stream);
    if ((long)pcVar3 < 0) {
      file_read_aligned_cold_2();
      goto LAB_0018d3c9;
    }
    iVar2 = fseek(__stream,0,0);
    filename = pcVar3;
    if (iVar2 < 0) {
      file_read_aligned_cold_3();
      goto LAB_0018d3c9;
    }
    bVar1 = true;
  }
  if (bVar1) {
    __ptr = (u8 *)calloc(1,-align & (ulong)(filename + (align - 1)));
    if (__ptr == (u8 *)0x0) {
      file_read_aligned_cold_5();
    }
    else {
      sVar4 = fread(__ptr,(size_t)filename,1,__stream);
      if (sVar4 == 1) {
        fclose(__stream);
        out_file_data->data = __ptr;
        out_file_data->size = -align & (ulong)(filename + (align - 1));
        return OK;
      }
      file_read_aligned_cold_4();
    }
  }
LAB_0018d3d9:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return ERROR;
}

Assistant:

Result file_read_aligned(const char* filename, size_t align,
                         FileData* out_file_data) {
  FILE* f = fopen(filename, "rb");
  CHECK_MSG(f, "unable to open file \"%s\".\n", filename);
  long size;
  CHECK(SUCCESS(get_file_size(f, &size)));
  long aligned_size = ALIGN_UP(size, align);
  u8* data = xcalloc(1, aligned_size);
  CHECK_MSG(data, "allocation failed.\n");
  CHECK_MSG(fread(data, size, 1, f) == 1, "fread failed.\n");
  fclose(f);
  out_file_data->data = data;
  out_file_data->size = aligned_size;
  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}